

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseContextBase.cpp
# Opt level: O0

TVariable * __thiscall
glslang::TParseContextBase::getEditableVariable(TParseContextBase *this,char *name)

{
  TSymbolTable *this_00;
  int iVar1;
  TSymbol *pTVar2;
  undefined4 extraout_var;
  pool_allocator<char> local_60;
  TString local_58;
  TSymbol *local_30;
  TSymbol *symbol;
  char *pcStack_20;
  bool builtIn;
  char *name_local;
  TParseContextBase *this_local;
  
  this_00 = this->symbolTable;
  pcStack_20 = name;
  name_local = (char *)this;
  pool_allocator<char>::pool_allocator(&local_60);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_58,
             name,&local_60);
  pTVar2 = TSymbolTable::find(this_00,&local_58,(bool *)((long)&symbol + 7),(bool *)0x0,(int *)0x0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string(&local_58);
  local_30 = pTVar2;
  if (pTVar2 != (TSymbol *)0x0) {
    if (pTVar2 == (TSymbol *)0x0) {
      this_local = (TParseContextBase *)0x0;
    }
    else {
      if ((symbol._7_1_ & 1) != 0) {
        (*(this->super_TParseVersions)._vptr_TParseVersions[0x4e])(this,&local_30);
      }
      iVar1 = (*local_30->_vptr_TSymbol[9])();
      this_local = (TParseContextBase *)CONCAT44(extraout_var,iVar1);
    }
    return (TVariable *)this_local;
  }
  __assert_fail("symbol != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseContextBase.cpp"
                ,0x154,
                "virtual TVariable *glslang::TParseContextBase::getEditableVariable(const char *)");
}

Assistant:

TVariable* TParseContextBase::getEditableVariable(const char* name)
{
    bool builtIn;
    TSymbol* symbol = symbolTable.find(name, &builtIn);

    assert(symbol != nullptr);
    if (symbol == nullptr)
        return nullptr;

    if (builtIn)
        makeEditable(symbol);

    return symbol->getAsVariable();
}